

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

AspifTextOutput * __thiscall Potassco::AspifTextOutput::push(AspifTextOutput *this,LitSpan *lits)

{
  undefined4 uVar1;
  size_t sVar2;
  Span<int> *in_RSI;
  AspifTextOutput *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa8;
  Data *this_00;
  int *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  const_iterator __position;
  
  this_00 = in_RDI->data_;
  __position._M_current = (uint *)in_RDI;
  sVar2 = size<int>(in_RSI);
  uVar1 = (undefined4)sVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this_00->directives,(value_type_conflict1 *)in_stack_ffffffffffffffa8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffffa8);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)this_00,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)in_stack_ffffffffffffffa8);
  begin<int>(in_RSI);
  end<int>((Span<int> *)0x1104c2);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<int_const*,void>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI,__position,
             (int *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
  return in_RDI;
}

Assistant:

AspifTextOutput& AspifTextOutput::push(const LitSpan& lits) {
	data_->directives.push_back(static_cast<uint32_t>(size(lits)));
	data_->directives.insert(data_->directives.end(), begin(lits), end(lits));
	return *this;
}